

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_draw.cpp
# Opt level: O0

void __thiscall
Am_Drawonable_Impl::adjust_gcvalues_color_xor
          (Am_Drawonable_Impl *this,XGCValues *values,unsigned_long *mask,unsigned_long fore_index)

{
  unsigned_long local_28;
  unsigned_long fore_index_local;
  unsigned_long *mask_local;
  XGCValues *values_local;
  Am_Drawonable_Impl *this_local;
  
  local_28 = fore_index;
  if (this->screen->whitepixel != 0) {
    if (fore_index == this->screen->blackpixel) {
      local_28 = this->screen->whitepixel;
    }
    else if (fore_index == this->screen->whitepixel) {
      local_28 = this->screen->blackpixel;
    }
  }
  adjust_gcvalues_color(values,mask,local_28);
  return;
}

Assistant:

void
Am_Drawonable_Impl::adjust_gcvalues_color_xor(XGCValues &values,
                                              unsigned long &mask,
                                              unsigned long fore_index) const
{
  // Compensate for white == 1 on an HP-type display
  if (screen->whitepixel) {
    if (fore_index == screen->blackpixel)
      fore_index = screen->whitepixel;
    else if (fore_index == screen->whitepixel)
      fore_index = screen->blackpixel;
  }

  adjust_gcvalues_color(values, mask, fore_index);
}